

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O0

int handle_keyb(void)

{
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  uint value;
  uint mask;
  int clen;
  int i;
  char cmd [25];
  char *in_stack_000000a8;
  uint local_38;
  uint local_34;
  int local_30;
  undefined4 local_2c;
  char local_28;
  char local_27 [8];
  undefined1 local_1f [31];
  
  memset(&local_28,0,0x19);
  sVar2 = read(0,&local_28,0x18);
  if (sVar2 < 0x13) {
    sVar3 = strlen(&local_28);
    if (sVar3 != 0) {
      sVar3 = strlen(&local_28);
      *(undefined1 *)((long)&local_2c + sVar3 + 3) = 0;
    }
    sVar3 = strlen(local_27);
    local_30 = (int)sVar3;
    switch(local_28) {
    case ' ':
      break;
    default:
      break;
    case '#':
      notch = 1;
      break;
    case '*':
      for (local_2c = 0; local_2c < idx; local_2c = local_2c + 1) {
        memset(sniftab[local_2c].notch.data,0,(long)max_dlen);
      }
      break;
    case '+':
    case '-':
      if (local_30 == 6) {
        __isoc99_sscanf(local_27,"%x",&local_38);
        local_34 = local_38 | 0xffff800;
        local_38 = local_38 >> 0xc & 0x7ff;
        do_modify_sniftab(local_38,local_34,local_28);
      }
      else if (local_30 == 0x10) {
        __isoc99_sscanf(local_1f,"%x",&local_34);
        local_1f[0] = 0;
        __isoc99_sscanf(local_27,"%x",&local_38);
        local_34 = local_34 | 0x80000000;
        local_38 = local_38 | 0x80000000;
        do_modify_sniftab(local_38,local_34,local_28);
      }
      else if ((local_30 == 3) || (local_30 == 8)) {
        __isoc99_sscanf(local_27,"%x",&local_38);
        if (local_30 == 8) {
          local_38 = local_38 | 0x80000000;
        }
        iVar1 = sniftab_index(local_38);
        if (-1 < iVar1) {
          if (local_28 == '+') {
            sniftab[iVar1].flags = sniftab[iVar1].flags | 1;
          }
          else {
            sniftab[iVar1].flags = sniftab[iVar1].flags & 0xfffffffe;
          }
        }
      }
      break;
    case '8':
      binary8 = '\x01';
    case 'b':
      binary_gap = '\0';
      if (binary == '\0') {
        binary = '\x01';
        switchvdl("|");
      }
      else {
        binary = '\0';
        switchvdl(" | ");
      }
      break;
    case '@':
      print_ascii = print_ascii ^ 1;
      break;
    case 'A':
      local_38 = 0x80000000;
      local_34 = 0x80000000;
      do_modify_sniftab(0x80000000,0x80000000,'+');
      break;
    case 'B':
      binary_gap = '\x01';
      switchvdl(" | ");
      binary = binary == '\0';
      break;
    case 'N':
      local_38 = 0x80000000;
      local_34 = 0x80000000;
      do_modify_sniftab(0x80000000,0x80000000,'-');
      break;
    case 'a':
      local_38 = 0;
      local_34 = 0xffff800;
      do_modify_sniftab(0,0xffff800,'+');
      break;
    case 'c':
      color = color == '\0';
      break;
    case 'n':
      local_38 = 0;
      local_34 = 0xffff800;
      do_modify_sniftab(0,0xffff800,'-');
      break;
    case 'q':
      running = 0;
      break;
    case 'r':
      iVar1 = readsettings(in_stack_000000a8);
      if (iVar1 < 0) {
        return 0;
      }
      break;
    case 'w':
      iVar1 = writesettings(_clen);
      if (iVar1 != 0) {
        return 0;
      }
    }
    clearscreen = 1;
  }
  return 1;
}

Assistant:

int handle_keyb(void)
{
	char cmd [25] = {0};
	int i, clen;
	unsigned int mask;
	unsigned int value;

	if (read(0, cmd, 24) > (long)strlen("+1234567812345678\n"))
		return 1; /* ignore */

	if (strlen(cmd) > 0)
		cmd[strlen(cmd)-1] = 0; /* chop off trailing newline */

	clen = strlen(&cmd[1]); /* content length behind command */

	switch (cmd[0]) {

	case '+':
	case '-':
		if (clen == 6) {
			/* masking strict SFF ID content vvvmmm */
			sscanf(&cmd[1], "%x", &value);
			mask = value | 0xFFFF800; /* cleared flags! */
			value >>= 12;
			value &= 0x7FF;
			do_modify_sniftab(value, mask, cmd[0]);
			break;
		} else if (clen == 16) {
			sscanf(&cmd[9], "%x", &mask);
			cmd[9] = 0; /* terminate 'value' */
			sscanf(&cmd[1], "%x", &value);
			mask |= CAN_EFF_FLAG;
			value |= CAN_EFF_FLAG;
			do_modify_sniftab(value, mask, cmd[0]);
			break;
		}

		/* check for single SFF/EFF CAN ID length */
		if (clen != 3 && clen != 8)
			break;

		/* enable/disable single SFF/EFF CAN ID */
		sscanf(&cmd[1], "%x", &value);
		if (clen == 8)
			value |= CAN_EFF_FLAG;

		i = sniftab_index(value);
		if (i < 0)
			break; /* No Match */

		if (cmd[0] == '+')
			do_set(i, ENABLE);
		else
			do_clr(i, ENABLE);

		break;

	case 'a' : /* all SFF CAN IDs */
		value = 0;
		mask = 0xFFFF800; /* cleared flags! */
		do_modify_sniftab(value, mask, '+');
		break;

	case 'n' : /* none SFF CAN IDs */
		value = 0;
		mask = 0xFFFF800; /* cleared flags! */
		do_modify_sniftab(value, mask, '-');
		break;

	case 'A' : /* all EFF CAN IDs */
		value = CAN_EFF_FLAG;
		mask = CAN_EFF_FLAG;
		do_modify_sniftab(value, mask, '+');
		break;

	case 'N' : /* none EFF CAN IDs */
		value = CAN_EFF_FLAG;
		mask = CAN_EFF_FLAG;
		do_modify_sniftab(value, mask, '-');
		break;

	case 'w' :
		if (writesettings(&cmd[1]))
			return 0;
		break;

	case 'r' :
		if (readsettings(&cmd[1]) < 0)
			return 0;
		break;

	case 'q' :
		running = 0;
		break;

	case '@' :
		/* toggle ASCII output */
		print_ascii ^= 1;
		break;

	case 'B' :
		binary_gap = 1;
		switchvdl(LDL);
		if (binary)
			binary = 0;
		else
			binary = 1;

		break;

	case '8' :
		binary8 = 1;
		/* fallthrough */

	case 'b' :
		binary_gap = 0;
		if (binary) {
			binary = 0;
			switchvdl(LDL);
		} else {
			binary = 1;
			switchvdl(SDL);
		}
		break;

	case 'c' :
		if (color)
			color = 0;
		else
			color = 1;

		break;

	case ' ' :
		clearscreen = 1;
		break;

	case '#' :
		notch = 1;
		break;

	case '*' :
		for (i = 0; i < idx; i++)
			memset(&sniftab[i].notch.data, 0, max_dlen);
		break;

	default:
		break;
	}

	clearscreen = 1;

	return 1; /* ok */
}